

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

QRect __thiscall
QTreeViewPrivate::intersectedRect
          (QTreeViewPrivate *this,QRect rect,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  long lVar1;
  QAbstractItemModel *pQVar2;
  Data *pDVar3;
  int iVar4;
  Representation RVar5;
  bool bVar6;
  char cVar7;
  Representation RVar8;
  Representation RVar9;
  int logicalIndex;
  int iVar10;
  long in_FS_OFFSET;
  QRect QVar11;
  undefined1 local_d8 [16];
  QModelIndex local_c8;
  QRect local_a8;
  QModelIndex local_98;
  QRect local_78;
  undefined1 *local_68;
  undefined1 *puStack_60;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_58;
  QRect rect_local;
  
  rect_local._8_8_ = rect._8_8_;
  rect_local._0_8_ = rect._0_8_;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::parent((QModelIndex *)&local_68,topLeft);
  QAbstractItemViewPrivate::executePostedLayout(&this->super_QAbstractItemViewPrivate);
  local_78 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  RVar9.m_i = 0x7fffffff;
  iVar4 = -0x80000000;
  for (iVar10 = topLeft->r; iVar10 <= bottomRight->r; iVar10 = iVar10 + 1) {
    local_98.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.r = -0x55555556;
    local_98.c = -0x55555556;
    local_98.i._0_4_ = 0xaaaaaaaa;
    local_98.i._4_4_ = 0xaaaaaaaa;
    pQVar2 = (this->super_QAbstractItemViewPrivate).model;
    (**(code **)(*(long *)pQVar2 + 0x60))(&local_98,pQVar2,iVar10,0,(QModelIndex *)&local_68);
    bVar6 = isRowHidden(this,&local_98);
    if (!bVar6) {
      local_a8 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
      RVar5.m_i = iVar4;
      if (RVar9.m_i == 0x7fffffff) {
        pDVar3 = (this->spanningIndexes).q_hash.d;
        if ((pDVar3 != (Data *)0x0) && (pDVar3->size != 0)) {
          QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_c8,&local_98)
          ;
          bVar6 = QHash<QPersistentModelIndex,_QHashDummyValue>::contains
                            (&(this->spanningIndexes).q_hash,(QPersistentModelIndex *)&local_c8);
          QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_c8);
          if (bVar6) {
            local_a8 = visualRect(this,&local_98,FullRow);
            cVar7 = QRect::intersects(&local_a8);
            RVar9.m_i = 0x7fffffff;
            if (cVar7 != '\0') goto LAB_005420e1;
            goto LAB_00542122;
          }
        }
        for (logicalIndex = topLeft->c; logicalIndex <= bottomRight->c;
            logicalIndex = logicalIndex + 1) {
          bVar6 = QHeaderView::isSectionHidden(this->header,logicalIndex);
          if (!bVar6) {
            local_c8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
            local_c8.r = -0x55555556;
            local_c8.c = -0x55555556;
            local_c8.i._0_4_ = 0xaaaaaaaa;
            local_c8.i._4_4_ = 0xaaaaaaaa;
            pQVar2 = (this->super_QAbstractItemViewPrivate).model;
            (**(code **)(*(long *)pQVar2 + 0x60))
                      (&local_c8,pQVar2,iVar10,logicalIndex,(QModelIndex *)&local_68);
            local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_d8 = (undefined1  [16])visualRect(this,&local_c8,SingleSection);
            if (local_d8._4_4_ + -1 != local_d8._12_4_ || local_d8._8_4_ != local_d8._0_4_ + -1) {
              if ((rect_local.y2.m_i < local_d8._4_4_) || (local_d8._12_4_ < rect_local.y1.m_i))
              break;
              cVar7 = QRect::intersects((QRect *)local_d8);
              if (cVar7 != '\0') {
                local_a8 = (QRect)QRect::operator|(&local_a8,(QRect *)local_d8);
                if ((local_a8.x1.m_i.m_i < rect_local.x1.m_i) &&
                   (rect_local.x2.m_i < local_a8.x2.m_i.m_i)) break;
              }
            }
          }
        }
        if (local_a8.x1.m_i <= local_a8.x2.m_i) {
          if (local_a8.y1.m_i <= local_a8.y2.m_i) {
            RVar9.m_i = local_a8.x1.m_i;
            RVar5.m_i = local_a8.x2.m_i;
            if (local_a8.x2.m_i < iVar4) {
              RVar5.m_i = iVar4;
            }
            goto LAB_005420e1;
          }
        }
        RVar9.m_i = 0x7fffffff;
      }
      else {
        local_a8 = visualRect(this,&local_98,FullRow);
        cVar7 = QRect::intersects(&local_a8);
        if (cVar7 == '\0') goto LAB_00542122;
        RVar8.m_i = local_a8.y1.m_i + -1 + local_a8.y2.m_i;
        local_a8.x1.m_i = RVar9.m_i;
        local_a8.x2.m_i = iVar4 + RVar9.m_i + -1;
        local_a8.y2.m_i = RVar8.m_i;
      }
LAB_005420e1:
      QVar11 = (QRect)QRect::operator|(&local_78,&local_a8);
      local_78 = QVar11;
      cVar7 = QRect::contains(&local_78,SUB81(&rect_local,0));
      iVar4 = RVar5.m_i;
      if (cVar7 != '\0') break;
    }
LAB_00542122:
  }
  QVar11 = (QRect)QRect::operator&(&rect_local,&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return QVar11;
}

Assistant:

QRect QTreeViewPrivate::intersectedRect(const QRect rect, const QModelIndex &topLeft, const QModelIndex &bottomRight) const
{
    const auto parentIdx = topLeft.parent();
    executePostedLayout();
    QRect updateRect;
    int left = std::numeric_limits<int>::max();
    int right = std::numeric_limits<int>::min();
    for (int row = topLeft.row(); row <= bottomRight.row(); ++row) {
        const auto idxCol0 = model->index(row, 0, parentIdx);
        if (isRowHidden(idxCol0))
            continue;
        QRect rowRect;
        if (left != std::numeric_limits<int>::max()) {
            // we already know left and right boundary of the rect to update
            rowRect = visualRect(idxCol0, FullRow);
            if (!rowRect.intersects(rect))
                continue;
            rowRect = QRect(left, rowRect.top(), right, rowRect.bottom());
        } else if (!spanningIndexes.isEmpty() && spanningIndexes.contains(idxCol0)) {
            // isFirstColumnSpanned re-creates the child index so take a shortcut here
            // spans the whole row, therefore ask for FullRow instead for every cell
            rowRect = visualRect(idxCol0, FullRow);
            if (!rowRect.intersects(rect))
                continue;
        } else {
            for (int col = topLeft.column(); col <= bottomRight.column(); ++col) {
                if (header->isSectionHidden(col))
                    continue;
                const QModelIndex idx(model->index(row, col, parentIdx));
                const QRect idxRect = visualRect(idx, SingleSection);
                if (idxRect.isNull())
                    continue;
                // early exit when complete row is out of viewport
                if (idxRect.top() > rect.bottom() || idxRect.bottom() < rect.top())
                    break;
                if (!idxRect.intersects(rect))
                    continue;
                rowRect = rowRect.united(idxRect);
                if (rowRect.left() < rect.left() && rowRect.right() > rect.right())
                    break;
            }
            if (rowRect.isValid()) {
                left = std::min(left, rowRect.left());
                right = std::max(right, rowRect.right());
            }
        }
        updateRect = updateRect.united(rowRect);
        if (updateRect.contains(rect))  // already full rect covered?
            break;
    }
    return rect.intersected(updateRect);
}